

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O0

VariableIndex __thiscall
cnn::ComputationGraph::add_lookup(ComputationGraph *this,LookupParameters *p,uint index)

{
  size_type sVar1;
  LookupParameters *in_RSI;
  LookupNode *in_RDI;
  LookupNode *new_node;
  undefined4 in_stack_00000048;
  VariableIndex *new_node_index;
  value_type *in_stack_ffffffffffffff98;
  uint uVar2;
  LookupNode *this_00;
  uint local_20 [8];
  
  this_00 = in_RDI;
  sVar1 = std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::size
                    ((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)in_RSI);
  local_20[0] = (uint)sVar1;
  VariableIndex::VariableIndex((VariableIndex *)this_00,local_20);
  operator_new(0xa8);
  LookupNode::LookupNode(this_00,in_RSI,(uint)((ulong)in_RDI >> 0x20));
  std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::push_back
            ((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)in_RDI,in_stack_ffffffffffffff98);
  uVar2 = (uint)in_RDI;
  std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::push_back
            ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)this_00,
             (value_type *)in_RSI);
  set_dim_for_new_node((ComputationGraph *)p,(VariableIndex *)CONCAT44(index,in_stack_00000048));
  return (VariableIndex)uVar2;
}

Assistant:

VariableIndex ComputationGraph::add_lookup(LookupParameters* p, unsigned index) {
  VariableIndex new_node_index(nodes.size());
  LookupNode* new_node = new LookupNode(p, index);
  nodes.push_back(new_node);
  parameter_nodes.push_back(new_node_index);
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}